

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

int lyb_skip_subtree(char *data,lyb_state *lybs)

{
  uint uVar1;
  uint uVar2;
  size_t *psVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = (ulong)(uint)lybs->used;
  psVar3 = lybs->written;
  iVar5 = 0;
  do {
    uVar1 = (uint)lybs->inner_chunks[(long)(int)uVar4 + -1] * 2;
    uVar2 = lyb_read(data + uVar1,(uint8_t *)0x0,psVar3[(long)(int)uVar4 + -1],lybs);
    if ((int)uVar2 < 0) {
      return -1;
    }
    iVar5 = iVar5 + uVar1 + uVar2;
    data = data + uVar1 + uVar2;
    psVar3 = lybs->written;
    uVar4 = (ulong)lybs->used;
  } while (psVar3[uVar4 - 1] != 0);
  return iVar5;
}

Assistant:

static int
lyb_skip_subtree(const char *data, struct lyb_state *lybs)
{
    int r, ret = 0;

    do {
        /* first skip any meta information inside */
        r = lybs->inner_chunks[lybs->used - 1] * LYB_META_BYTES;
        data += r;
        ret += r;

        /* then read data */
        ret += (r = lyb_read(data, NULL, lybs->written[lybs->used - 1], lybs));
        LYB_HAVE_READ_RETURN(r, data, -1);
    } while (lybs->written[lybs->used - 1]);

    return ret;
}